

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_thread.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  id this;
  runtime_error *prVar2;
  bool flags [3];
  thread t2_2;
  thread t1_2;
  thread t3;
  thread t2;
  counted_functor f;
  recursive_mutex m_1;
  thread t1;
  thread t3_4;
  thread t;
  ostringstream oss;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Test execution");
  std::endl<char,std::char_traits<char>>(poVar1);
  if (called_ != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xcb);
    std::operator<<(poVar1," !called_");
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,(string *)&m_1);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::thread::thread<void(&)(),,void>(&t,caller);
  std::thread::join();
  if (called_ == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xce);
    std::operator<<(poVar1," called_");
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,(string *)&m_1);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::thread::~thread(&t);
  poVar1 = std::operator<<((ostream *)&std::cout,"Functor destruction");
  std::endl<char,std::char_traits<char>>(poVar1);
  if (counted_functor::objects != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xd2);
    std::operator<<(poVar1," counted_functor::objects==0");
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,(string *)&m_1);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  counted_functor::add(1);
  std::thread::thread<counted_functor&,,void>(&t,&f);
  if (counted_functor::objects < 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xd6);
    std::operator<<(poVar1," counted_functor::objects>=2");
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,(string *)&m_1);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::thread::join();
  if (counted_functor::objects != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xd8);
    std::operator<<(poVar1," counted_functor::objects==1");
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,(string *)&m_1);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::thread::~thread(&t);
  counted_functor::~counted_functor(&f);
  if (counted_functor::objects != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xda);
    std::operator<<(poVar1," counted_functor::objects==0");
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,(string *)&m_1);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  counted_functor::add(1);
  std::thread::thread<counted_functor&,,void>(&t,&f);
  if (counted_functor::objects < 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xdf);
    std::operator<<(poVar1," counted_functor::objects>=2");
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,(string *)&m_1);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::thread::detach();
  std::thread::~thread(&t);
  counted_functor::~counted_functor(&f);
  if (counted_functor::objects < 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xe2);
    std::operator<<(poVar1," counted_functor::objects>=1");
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,(string *)&m_1);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::ptime::millisleep(400);
  if (counted_functor::objects != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xe4);
    std::operator<<(poVar1," counted_functor::objects==0");
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,(string *)&m_1);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Test recursive mutex");
  std::endl<char,std::char_traits<char>>(poVar1);
  _oss = 0;
  std::recursive_mutex::lock((recursive_mutex *)&oss);
  std::recursive_mutex::lock((recursive_mutex *)&oss);
  pthread_mutex_unlock((pthread_mutex_t *)&oss);
  pthread_mutex_unlock((pthread_mutex_t *)&oss);
  variable = 0;
  m_1.super___recursive_mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  m_1.super___recursive_mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  m_1.super___recursive_mutex_base._M_mutex.__align = 0;
  m_1.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  m_1.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  _f = (native_handle_type)&m_1;
  std::thread::thread<incrementer<std::recursive_mutex>&,,void>
            (&t1,(incrementer<std::recursive_mutex> *)&f);
  std::thread::thread<incrementer<std::recursive_mutex>&,,void>
            (&t2,(incrementer<std::recursive_mutex> *)&f);
  std::thread::join();
  std::thread::join();
  if (variable != 10) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xfa);
    std::operator<<(poVar1," variable == 10");
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,(string *)&t);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::thread::~thread(&t2);
  std::thread::~thread(&t1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Test mutex");
  std::endl<char,std::char_traits<char>>(poVar1);
  variable = 0;
  m_1.super___recursive_mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  m_1.super___recursive_mutex_base._M_mutex._16_8_ = 0;
  m_1.super___recursive_mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  m_1.super___recursive_mutex_base._M_mutex.__align = 0;
  m_1.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  _f = (native_handle_type)&m_1;
  std::thread::thread<incrementer<std::mutex>&,,void>(&t1,(incrementer<std::mutex> *)&f);
  std::thread::thread<incrementer<std::mutex>&,,void>(&t2,(incrementer<std::mutex> *)&f);
  std::thread::join();
  std::thread::join();
  if (variable != 10) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x105);
    std::operator<<(poVar1," variable == 10");
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,(string *)&t);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::thread::~thread(&t2);
  std::thread::~thread(&t1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Test thread specific");
  std::endl<char,std::char_traits<char>>(poVar1);
  booster::thread_specific_ptr<tls_object>::thread_specific_ptr
            ((thread_specific_ptr<tls_object> *)&t);
  t2._M_id._M_thread = (id)(id)&t;
  _f = (native_handle_type)&t;
  t1._M_id._M_thread = (id)(id)&t;
  std::thread::thread<tls_functor&,,void>(&t1_2,(tls_functor *)&f);
  std::thread::thread<tls_functor&,,void>(&t2_2,(tls_functor *)&t1);
  std::thread::thread<tls_functor&,,void>(&t3,(tls_functor *)&t2);
  std::thread::join();
  std::thread::join();
  std::thread::join();
  if (tls_ok == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x115);
    std::operator<<(poVar1," tls_ok");
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,(string *)&m_1);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (dtor_called != 3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x116);
    std::operator<<(poVar1," dtor_called == 3");
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,(string *)&m_1);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::thread::~thread(&t3);
  std::thread::~thread(&t2_2);
  std::thread::~thread(&t1_2);
  booster::intrusive_ptr<booster::details::key>::~intrusive_ptr
            ((intrusive_ptr<booster::details::key> *)&t);
  poVar1 = std::operator<<((ostream *)&std::cout,"Non synchronous thread specific");
  std::endl<char,std::char_traits<char>>(poVar1);
  dtor_called = 0;
  this._M_thread = (native_handle_type)operator_new(8);
  booster::thread_specific_ptr<tls_object>::thread_specific_ptr
            ((thread_specific_ptr<tls_object> *)this._M_thread);
  _f = this._M_thread;
  t1._M_id._M_thread = (id)(id)this._M_thread;
  t._M_id._M_thread = (id)(id)this._M_thread;
  std::thread::thread<tls_functor2&,,void>(&t2,(tls_functor2 *)&t);
  std::thread::thread<tls_functor2&,,void>(&t1_2,(tls_functor2 *)&f);
  std::thread::thread<tls_functor2&,,void>(&t2_2,(tls_functor2 *)&t1);
  booster::ptime::millisleep(300);
  booster::intrusive_ptr<booster::details::key>::~intrusive_ptr
            ((intrusive_ptr<booster::details::key> *)this._M_thread);
  operator_delete((void *)this._M_thread);
  std::thread::join();
  std::thread::join();
  std::thread::join();
  if (dtor_called != 3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,300);
    std::operator<<(poVar1," dtor_called == 3");
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,(string *)&m_1);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::thread::~thread(&t2_2);
  std::thread::~thread(&t1_2);
  std::thread::~thread(&t2);
  poVar1 = std::operator<<((ostream *)&std::cout,"Thest conditional variable notify one");
  std::endl<char,std::char_traits<char>>(poVar1);
  t3._M_id._M_thread._0_4_ = 0;
  t._M_id._M_thread = (id)0;
  std::condition_variable::condition_variable((condition_variable *)&m_1);
  t1._M_id._M_thread = (id)(id)&t3;
  std::thread::thread<cond_incrementer&,,void>(&t2,(cond_incrementer *)&t1);
  std::thread::thread<cond_incrementer&,,void>(&t1_2,(cond_incrementer *)&t1);
  std::thread::thread<cond_incrementer&,,void>(&t2_2,(cond_incrementer *)&t1);
  booster::ptime::millisleep(100);
  if ((int)t3._M_id._M_thread != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x138);
    std::operator<<(poVar1," counter == 0");
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,(string *)&f);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::condition_variable::notify_one();
  booster::ptime::millisleep(100);
  if ((int)t3._M_id._M_thread == 1) {
    std::condition_variable::notify_one();
    booster::ptime::millisleep(100);
    if ((int)t3._M_id._M_thread != 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar1 = std::operator<<((ostream *)&oss,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x13e);
      std::operator<<(poVar1," counter == 2");
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar2,(string *)&f);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::condition_variable::notify_one();
    booster::ptime::millisleep(100);
    if ((int)t3._M_id._M_thread != 3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar1 = std::operator<<((ostream *)&oss,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x141);
      std::operator<<(poVar1," counter == 3");
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar2,(string *)&f);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::thread::join();
    std::thread::join();
    std::thread::join();
    std::thread::~thread(&t2_2);
    std::thread::~thread(&t1_2);
    std::thread::~thread(&t2);
    std::condition_variable::~condition_variable((condition_variable *)&m_1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Thest conditional variable notify all");
    std::endl<char,std::char_traits<char>>(poVar1);
    t2._M_id._M_thread = (id)0;
    t._M_id._M_thread = (id)0;
    std::condition_variable::condition_variable((condition_variable *)&m_1);
    t1._M_id._M_thread = (id)(id)&t2;
    std::thread::thread<cond_incrementer&,,void>(&t1_2,(cond_incrementer *)&t1);
    t1._M_id._M_thread = (id)((long)t1._M_id._M_thread + 4);
    std::thread::thread<cond_incrementer&,,void>(&t2_2,(cond_incrementer *)&t1);
    t1._M_id._M_thread = (id)((long)t1._M_id._M_thread + 4);
    std::thread::thread<cond_incrementer&,,void>(&t3,(cond_incrementer *)&t1);
    booster::ptime::millisleep(100);
    if (((int)t2._M_id._M_thread == 0) && (t2._M_id._M_thread._4_4_ == 0)) {
      std::condition_variable::notify_all();
      booster::ptime::millisleep(100);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar1 = std::operator<<((ostream *)&oss,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x155);
      std::operator<<(poVar1," counter[0]==1 && counter[1]==1 && counter[2]==1");
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar2,(string *)&f);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x152);
    std::operator<<(poVar1," counter[0]==0 && counter[1]==0 && counter[2]==0");
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,(string *)&f);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,"Error ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x13b);
  std::operator<<(poVar1," counter == 1");
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar2,(string *)&f);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	try {
		{
			std::cout << "Test execution" << std::endl;
			TEST(!called_);
			booster::thread t(caller);
			t.join();
			TEST(called_);
		}
		{
			std::cout << "Functor destruction" << std::endl;
			TEST(counted_functor::objects==0);
			{
				counted_functor f;
				booster::thread t(f);
				TEST(counted_functor::objects>=2);
				t.join();
				TEST(counted_functor::objects==1);
			}
			TEST(counted_functor::objects==0);
			{
				{
                    counted_functor f;
                    booster::thread t(f);
                    TEST(counted_functor::objects>=2);
                    t.detach();
                }
				TEST(counted_functor::objects>=1);
                booster::ptime::millisleep(400);
                TEST(counted_functor::objects==0);
			}
			
		}
		std::cout << "Test recursive mutex" << std::endl;
		{
			booster::recursive_mutex m;
			m.lock();
			m.lock();
			TEST("Double lock works");
			m.unlock();
			m.unlock();
			TEST("Got there");
		}
		{
			variable = 0;
			booster::recursive_mutex m;
			incrementer<booster::recursive_mutex> inc = { &m };
			booster::thread t1(inc);
			booster::thread t2(inc);
			t1.join();
			t2.join();
			TEST(variable == 10);
		}
		std::cout << "Test mutex" << std::endl;
		{
			variable = 0;
			booster::mutex m;
			incrementer<booster::mutex> inc = { &m };
			booster::thread t1(inc);
			booster::thread t2(inc);
			t1.join();
			t2.join();
			TEST(variable == 10);
		}
		std::cout << "Test thread specific" << std::endl;
		{
			booster::thread_specific_ptr<tls_object> p;
			tls_functor f1(p);
			tls_functor f2(p);
			tls_functor f3(p);
			booster::thread t1(f1);
			booster::thread t2(f2);
			booster::thread t3(f3);

			t1.join();
			t2.join();
			t3.join();

			TEST(tls_ok);
			TEST(dtor_called == 3);
		}
		std::cout << "Non synchronous thread specific" << std::endl;
		{
			dtor_called = 0;
			booster::thread_specific_ptr<tls_object> *p = new booster::thread_specific_ptr<tls_object>();
			
			tls_functor2 f1(*p);
			tls_functor2 f2(*p);
			tls_functor2 f3(*p);

			booster::thread t1(f1);
			booster::thread t2(f2);
			booster::thread t3(f3);

			booster::ptime::millisleep(300);
			delete p;
			
			t1.join();
			t2.join();
			t3.join();

			TEST(dtor_called == 3);
		}
		std::cout << "Thest conditional variable notify one" << std::endl;
		{
			int counter = 0;
			booster::mutex m;
			booster::condition_variable c;
			cond_incrementer inc = { &counter, &m , &c };
			booster::thread t1(inc);
			booster::thread t2(inc);
			booster::thread t3(inc);
			booster::ptime::millisleep(100);
			TEST(counter == 0);
			c.notify_one();
			booster::ptime::millisleep(100);
			TEST(counter == 1);
			c.notify_one();
			booster::ptime::millisleep(100);
			TEST(counter == 2);
			c.notify_one();
			booster::ptime::millisleep(100);
			TEST(counter == 3);
			t1.join();
			t2.join();
			t3.join();
		}
		std::cout << "Thest conditional variable notify all" << std::endl;
		{
			int counter[3] = { 0, 0 , 0 };
			booster::mutex m;
			booster::condition_variable c;
			cond_incrementer inc = { counter, &m , &c };
			booster::thread t1(inc);
			inc.counter++;
			booster::thread t2(inc);
			inc.counter++;
			booster::thread t3(inc);
			booster::ptime::millisleep(100);
			TEST(counter[0]==0 && counter[1]==0 && counter[2]==0);
			c.notify_all();
			booster::ptime::millisleep(100);
			TEST(counter[0]==1 && counter[1]==1 && counter[2]==1);
			t1.join();
			t2.join();
			t3.join();
		}
		std::cout << "Test shared_mutex write lock" << std::endl;
		{
			variable = 0;
			booster::shared_mutex m;
			incrementer<booster::shared_mutex> inc = { &m };
			booster::thread t1(inc);
			booster::thread t2(inc);
			t1.join();
			t2.join();
			TEST(variable == 10);
		}
		std::cout << "Test recursive_shared_mutex write lock" << std::endl;
		{
			variable = 0;
			booster::shared_mutex m;
			incrementer<booster::shared_mutex> inc = { &m };
			booster::thread t1(inc);
			booster::thread t2(inc);
			t1.join();
			t2.join();
			TEST(variable == 10);
		}
		std::cout << "Test shared_mutex shared/write lock" << std::endl;
		{
			booster::mutex fm;
			booster::shared_mutex sm;
			bool flags[3] = {false,false,false};
			bool mread_happened  = false;
			bool write_happened = false;
			bool error_occured = false ;
			rw_executor<booster::shared_mutex> exec1 = { flags + 0, true, &fm, &sm };
			rw_executor<booster::shared_mutex> exec2 = { flags + 1, true, &fm, &sm };
			rw_executor<booster::shared_mutex> exec3 = { flags + 2, true, &fm, &sm };
			booster::thread t1(exec1);
			booster::thread t2(exec2);
			booster::thread t3(exec3);

			for(int i=0;i<100;i++) {
				booster::ptime::millisleep(1);
				{
					booster::unique_lock<booster::mutex> l(fm);
					if(flags[0] && flags[1])
						mread_happened = true;
					if(flags[2])
						write_happened = true;
					if((flags[0] || flags[1]) && flags[2])
						error_occured = true;
				}
			}

			t1.join();
			t2.join();
			t3.join();

			TEST(mread_happened);
			TEST(write_happened);
			TEST(error_occured);
		}
		std::cout << "Test recursive_shared_mutex shared/write lock" << std::endl;
		{
			booster::mutex fm;
			booster::recursive_shared_mutex sm;
			bool flags[3] = {false,false,false};
			bool mread_happened  = false;
			bool write_happened = false;
			bool error_occured = false ;
			rw_executor<booster::recursive_shared_mutex> exec1 = { flags + 0, true, &fm, &sm };
			rw_executor<booster::recursive_shared_mutex> exec2 = { flags + 1, true, &fm, &sm };
			rw_executor<booster::recursive_shared_mutex> exec3 = { flags + 2, true, &fm, &sm };
			booster::thread t1(exec1);
			booster::thread t2(exec2);
			booster::thread t3(exec3);

			for(int i=0;i<100;i++) {
				booster::ptime::millisleep(1);
				{
					booster::unique_lock<booster::mutex> l(fm);
					if(flags[0] && flags[1])
						mread_happened = true;
					if(flags[2])
						write_happened = true;
					if((flags[0] || flags[1]) && flags[2])
						error_occured = true;
				}
			}

			t1.join();
			t2.join();
			t3.join();

			TEST(mread_happened);
			TEST(write_happened);
			TEST(error_occured);
		}
		std::cout << "Test recursive_shared_mutex recursive shared lock" << std::endl;
		{
			booster::recursive_shared_mutex l;
			bool read  = false;
			bool write = false;
			rw_shared_thread t1c = { &l, &read };
			rw_unique_thread t2c = { &l, &write };
			booster::thread t1(t1c);
			booster::thread t2(t2c);
			t1.join();
			t2.join();
			TEST(read);
			TEST(write);
		}

}
	catch(std::exception const &e)
	{
		std::cerr << "Fail:" <<e.what();
		return EXIT_FAILURE;
	}
	std::cout << "Ok" << std::endl;
	return EXIT_SUCCESS;
	
}